

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O2

void __thiscall
QSqlRelationalTableModel::setRelation
          (QSqlRelationalTableModel *this,int column,QSqlRelation *relation)

{
  long lVar1;
  QSqlRelation *this_00;
  pointer pQVar2;
  qsizetype i;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  QSharedPointer<QRelation> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < column) {
    lVar1 = *(long *)(this + 8);
    uVar3 = *(ulong *)(lVar1 + 0x2f8);
    if (uVar3 <= (uint)column) {
      QList<QSharedPointer<QRelation>_>::resize
                ((QList<QSharedPointer<QRelation>_> *)(lVar1 + 0x2e8),(ulong)(column + 1));
      lVar4 = uVar3 << 4;
      for (; uVar3 < *(ulong *)(lVar1 + 0x2f8); uVar3 = uVar3 + 1) {
        QSharedPointer<QRelation>::create<>();
        pQVar2 = QList<QSharedPointer<QRelation>_>::data
                           ((QList<QSharedPointer<QRelation>_> *)(lVar1 + 0x2e8));
        QSharedPointer<QRelation>::operator=
                  ((QSharedPointer<QRelation> *)((long)&(pQVar2->value).ptr + lVar4),&local_48);
        QSharedPointer<QRelation>::deref(local_48.d);
        lVar4 = lVar4 + 0x10;
      }
    }
    this_00 = *(QSqlRelation **)(*(long *)(lVar1 + 0x2f0) + (ulong)(uint)column * 0x10);
    this_00[1].tName.d.size = (qsizetype)this;
    QSqlRelation::operator=(this_00,relation);
    *(int *)&this_00[1].iColumn.d.d = column;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlRelationalTableModel::setRelation(int column, const QSqlRelation &relation)
{
    Q_D(QSqlRelationalTableModel);
    if (column < 0)
        return;
    if (d->relations.size() <= column) {
        const auto oldSize = d->relations.size();
        d->relations.resize(column + 1);
        for (auto i = oldSize; i < d->relations.size(); ++i)
            d->relations[i] = QSharedPointer<QRelation>::create();
    }
    d->relations.at(column)->init(this, relation, column);
}